

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

size_t nhdp_domain_process_mprtypes_tlv
                 (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t count;
  nhdp_domain *domain;
  rfc5444_reader_tlvblock_entry *tlv_local;
  size_t mprtypes_size_local;
  uint8_t *mprtypes_local;
  
  if (tlv == (rfc5444_reader_tlvblock_entry *)0x0) {
    *mprtypes = *(uint8_t *)((long)&_domain_list.next[-0x27].next + 1);
    mprtypes_local = (uint8_t *)0x1;
  }
  else {
    memset(mprtypes,0xff,mprtypes_size);
    __tempptr = (list_entity *)0x0;
    for (plVar1 = _domain_list.next; plVar1->prev != _domain_list.prev; plVar1 = plVar1->next) {
      plVar2 = (list_entity *)((long)&__tempptr->next + 1);
      mprtypes[(long)__tempptr] = *(uint8_t *)((long)&plVar1[-0x27].next + 1);
      __tempptr = plVar2;
      if (mprtypes_size <= plVar2) break;
    }
    mprtypes_local = (uint8_t *)__tempptr;
  }
  return (size_t)mprtypes_local;
}

Assistant:

size_t
nhdp_domain_process_mprtypes_tlv(uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t count;

  if (!tlv) {
    domain = list_first_element(&_domain_list, domain, _node);
    mprtypes[0] = domain->ext;

    return 1;
  }

  memset(mprtypes, 255, mprtypes_size);

  count = 0;
  list_for_each_element(&_domain_list, domain, _node) {
    mprtypes[count++] = domain->ext;
    if (count >= mprtypes_size) {
      break;
    }
  }
  return count;
}